

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithLongIntegerParameter_TestShell::
~TEST_MockExpectedCall_callWithLongIntegerParameter_TestShell
          (TEST_MockExpectedCall_callWithLongIntegerParameter_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    long value = 777;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("long int", call->getInputParameterType(paramName).asCharString());
    LONGS_EQUAL(value, call->getInputParameter(paramName).getLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> long int paramName: <777 (0x309)>", call->callToString().asCharString());
}